

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execAndiEa<(moira::Instr)88,(moira::Mode)4,(moira::Size)2>(Moira *this,u16 opcode)

{
  int *piVar1;
  ushort uVar2;
  u32 addr;
  u32 uVar3;
  uint val;
  bool error;
  bool local_29;
  
  uVar2 = (this->queue).irc;
  readExt(this);
  addr = computeEA<(moira::Mode)4,(moira::Size)2,0ul>(this,opcode & 7);
  uVar3 = readM<(moira::MemSpace)1,(moira::Size)2,64ul>(this,addr,&local_29);
  piVar1 = (int *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x38);
  *piVar1 = *piVar1 + -2;
  if (local_29 == false) {
    val = uVar3 | uVar2;
    (this->reg).sr.n = (bool)((byte)(val >> 0xf) & 1);
    (this->reg).sr.z = (short)val == 0;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
    uVar3 = (this->reg).pc;
    (this->reg).pc0 = uVar3;
    (this->queue).ird = (this->queue).irc;
    uVar3 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar3 + 2);
    (this->queue).irc = (u16)uVar3;
    writeM<(moira::MemSpace)1,(moira::Size)2,5ul>(this,addr,val);
  }
  return;
}

Assistant:

void
Moira::execAndiEa(u16 opcode)
{
    u32 ea, data, result;

    u32 src = readI<S>();
    int dst = _____________xxx(opcode);

    if (!readOp<M,S, STD_AE_FRAME>(dst, ea, data)) return;

    result = logic<I,S>(src, data);
    prefetch();

    writeOp <M,S, POLLIPL | REVERSE> (dst, ea, result);
}